

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Stop_Freeze_PDU::Stop_Freeze_PDU
          (Stop_Freeze_PDU *this,Simulation_Management_Header *SimMgrHeader,ClockTime *RealWorldTime
          ,StopFreezeReason SFR,FrozenBehavior FB,KUINT32 ReqID)

{
  KUINT32 ReqID_local;
  FrozenBehavior FB_local;
  StopFreezeReason SFR_local;
  ClockTime *RealWorldTime_local;
  Simulation_Management_Header *SimMgrHeader_local;
  Stop_Freeze_PDU *this_local;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header,SimMgrHeader);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Stop_Freeze_PDU_0032f810;
  DATA_TYPE::ClockTime::ClockTime(&this->m_RealWorldTime,RealWorldTime);
  this->m_ui8Reason = (KUINT8)SFR;
  this->m_ui8FrozenBehaviour = (KUINT8)FB;
  this->m_ui16Padding = 0;
  this->m_ui32RequestID = ReqID;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '\x0e';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  return;
}

Assistant:

Stop_Freeze_PDU::Stop_Freeze_PDU( const Simulation_Management_Header & SimMgrHeader, const ClockTime & RealWorldTime,
                                  StopFreezeReason SFR, FrozenBehavior FB, KUINT32 ReqID ) :
    Simulation_Management_Header( SimMgrHeader ),
    m_RealWorldTime( RealWorldTime ),
    m_ui8Reason( SFR ),
    m_ui8FrozenBehaviour( FB ),
    m_ui16Padding( 0 ),
    m_ui32RequestID( ReqID )
{
    m_ui8PDUType = Stop_Freeze_PDU_Type;
    m_ui16PDULength = STOP_FREEZE_PDU_SIZE;
}